

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_bauth.c
# Opt level: O0

size_t btokBAuthTStep3_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  undefined8 in_RSI;
  long in_RDI;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  undefined8 local_28;
  
  if ((ulong)(in_RDI * 0x10) < 0x41) {
    local_28 = 0x40;
  }
  else {
    local_28 = in_RDI << 4;
  }
  sVar1 = ecMulA_deep(local_28,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8);
  sVar2 = beltHash_keep();
  sVar3 = beltKRP_keep();
  sVar4 = beltMAC_keep();
  sVar1 = utilMax(5,in_RSI,sVar1,sVar2,sVar3,sVar4);
  return local_28 + sVar1;
}

Assistant:

static size_t btokBAuthTStep3_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return MAX2(O_OF_W(2 * n), 32 + 16 + 16) +
		utilMax(5,
			f_deep,
			ecMulA_deep(n, ec_d, ec_deep, n),
			beltHash_keep(),
			beltKRP_keep(),
			beltMAC_keep());
}